

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O1

bool adiak::value<std::__cxx11::string>
               (string *name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,int category
               ,string *subcategory)

{
  int iVar1;
  adiak_datatype_t *type;
  adiak_value_t *value_00;
  char *pcVar2;
  bool bVar3;
  
  type = adiak_get_basetype(adiak_string);
  if (type == (adiak_datatype_t *)0x0) {
    bVar3 = false;
  }
  else {
    value_00 = (adiak_value_t *)malloc(8);
    pcVar2 = strdup((value->_M_dataplus)._M_p);
    value_00->v_ptr = pcVar2;
    iVar1 = adiak_raw_namevalue((name->_M_dataplus)._M_p,category,(subcategory->_M_dataplus)._M_p,
                                value_00,type);
    bVar3 = iVar1 == 0;
  }
  return bVar3;
}

Assistant:

bool value(std::string name, T value, int category = adiak_general, std::string subcategory = "") {
      adiak_datatype_t *datatype = adiak::internal::parse<T>::make_type();
      if (!datatype)
         return false;
      adiak_value_t *avalue = (adiak_value_t *) malloc(sizeof(adiak_value_t));
      bool result = adiak::internal::parse<T>::make_value(value, avalue, datatype);
      if (!result)
         return false;
      return adiak_raw_namevalue(name.c_str(), category, subcategory.c_str(), avalue, datatype) == 0;
   }